

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcdel(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ndelete,LONGLONG bytepos,
          int *status)

{
  long nchars;
  long lVar1;
  long nchars_00;
  long local_2798;
  LONGLONG nbytes;
  LONGLONG remain;
  LONGLONG newlen;
  LONGLONG nseg;
  LONGLONG irow;
  LONGLONG ii;
  LONGLONG i2;
  LONGLONG i1;
  uchar buffer [10000];
  int *status_local;
  LONGLONG bytepos_local;
  LONGLONG ndelete_local;
  LONGLONG naxis2_local;
  LONGLONG naxis1_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (naxis2 == 0) {
      fptr_local._4_4_ = *status;
    }
    else {
      nchars = naxis1 - ndelete;
      if (nchars < 0x2711) {
        lVar1 = bytepos + 1;
        for (nseg = 1; nseg < naxis2; nseg = nseg + 1) {
          ffgtbb(fptr,nseg,lVar1 + ndelete,nchars,(uchar *)&i1,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,nseg,lVar1,nchars,(uchar *)&i1,status);
          fptr->Fptr->rowlength = naxis1;
        }
        nchars_00 = naxis1 - (bytepos + ndelete);
        if (0 < nchars_00) {
          ffgtbb(fptr,naxis2,lVar1 + ndelete,nchars_00,(uchar *)&i1,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,naxis2,lVar1,nchars_00,(uchar *)&i1,status);
          fptr->Fptr->rowlength = naxis1;
        }
      }
      else {
        lVar1 = (nchars + 9999) / 10000;
        for (nseg = 1; nseg < naxis2; nseg = nseg + 1) {
          i2 = bytepos + 1;
          ii = i2 + ndelete;
          local_2798 = nchars + (lVar1 + -1) * -10000;
          for (irow = 0; irow < lVar1; irow = irow + 1) {
            ffgtbb(fptr,nseg,ii,local_2798,(uchar *)&i1,status);
            fptr->Fptr->rowlength = nchars;
            ffptbb(fptr,nseg,i2,local_2798,(uchar *)&i1,status);
            fptr->Fptr->rowlength = naxis1;
            i2 = local_2798 + i2;
            ii = local_2798 + ii;
            local_2798 = 10000;
          }
        }
        local_2798 = naxis1 - (bytepos + ndelete);
        if (0 < local_2798) {
          lVar1 = (local_2798 + 9999) / 10000;
          i2 = bytepos + 1;
          ii = i2 + ndelete;
          local_2798 = local_2798 + (lVar1 + -1) * -10000;
          for (irow = 0; irow < lVar1; irow = irow + 1) {
            ffgtbb(fptr,naxis2,ii,local_2798,(uchar *)&i1,status);
            fptr->Fptr->rowlength = nchars;
            ffptbb(fptr,naxis2,i2,local_2798,(uchar *)&i1,status);
            fptr->Fptr->rowlength = naxis1;
            i2 = local_2798 + i2;
            ii = local_2798 + ii;
            local_2798 = 10000;
          }
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffcdel(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ndelete,    /* I - number of bytes to delete in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to delete bytes     */
           int *status)     /* IO - error status                            */
/*
 delete 'ndelete' bytes from each row of the table at position 'bytepos'.  */
{
    unsigned char buffer[10000];
    LONGLONG i1, i2, ii, irow, nseg;
    LONGLONG newlen, remain, nbytes;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    newlen = naxis1 - ndelete;

    if (newlen <= 10000)
    {
      /*******************************************************************
      CASE #1: optimal case where whole new row fits in the work buffer
      *******************************************************************/
      i1 = bytepos + 1;
      i2 = i1 + ndelete;
      for (irow = 1; irow < naxis2; irow++)
      {
        ffgtbb(fptr, irow, i2, newlen, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, irow, i1, newlen, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }

      /* now do the last row */
      remain = naxis1 - (bytepos + ndelete);

      if (remain > 0)
      {
        ffgtbb(fptr, naxis2, i2, remain, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, naxis2, i1, remain, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************/

        nseg = (newlen + 9999) / 10000;
        for (irow = 1; irow < naxis2; irow++)
        {
          i1 = bytepos + 1;
          i2 = i1 + ndelete;

          nbytes = newlen - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, irow, i2, nbytes, buffer, status); /* read bytes */
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, irow, i1, nbytes, buffer, status); /* rewrite bytes */
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }

        /* now do the last row */
        remain = naxis1 - (bytepos + ndelete);

        if (remain > 0)
        {
          nseg = (remain + 9999) / 10000;
          i1 = bytepos + 1;
          i2 = i1 + ndelete;
          nbytes = remain - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, naxis2, i2, nbytes, buffer, status);
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, naxis2, i1, nbytes, buffer, status); /* write row */
            (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }
    }
    return(*status);
}